

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::python::Generator::FixForeignFieldsInDescriptors(Generator *this)

{
  FileDescriptor *pFVar1;
  long lVar2;
  long lVar3;
  
  pFVar1 = this->file_;
  if (0 < *(int *)(pFVar1 + 0x2c)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      FixForeignFieldsInDescriptor
                (this,(Descriptor *)(*(long *)(pFVar1 + 0x58) + lVar2),(Descriptor *)0x0);
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0x88;
    } while (lVar3 < *(int *)(pFVar1 + 0x2c));
    if (0 < *(int *)(pFVar1 + 0x2c)) {
      lVar2 = 0;
      lVar3 = 0;
      do {
        AddMessageToFileDescriptor(this,(Descriptor *)(*(long *)(pFVar1 + 0x58) + lVar2));
        lVar3 = lVar3 + 1;
        pFVar1 = this->file_;
        lVar2 = lVar2 + 0x88;
      } while (lVar3 < *(int *)(pFVar1 + 0x2c));
    }
  }
  if (0 < *(int *)(pFVar1 + 0x30)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      AddEnumToFileDescriptor(this,(EnumDescriptor *)(*(long *)(pFVar1 + 0x60) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0x48;
    } while (lVar3 < *(int *)(pFVar1 + 0x30));
  }
  if (0 < *(int *)(pFVar1 + 0x3c)) {
    lVar2 = 0;
    lVar3 = 0;
    do {
      AddExtensionToFileDescriptor(this,(FieldDescriptor *)(*(long *)(pFVar1 + 0x70) + lVar2));
      lVar3 = lVar3 + 1;
      pFVar1 = this->file_;
      lVar2 = lVar2 + 0x48;
    } while (lVar3 < *(int *)(pFVar1 + 0x3c));
  }
  io::Printer::Print<char[5],char[11]>
            (this->printer_,"_sym_db.RegisterFileDescriptor($name$)\n",(char (*) [5])0x3ea8a1,
             (char (*) [11])"DESCRIPTOR");
  io::Printer::Print<>(this->printer_,"\n");
  return;
}

Assistant:

void Generator::FixForeignFieldsInDescriptors() const {
  for (int i = 0; i < file_->message_type_count(); ++i) {
    FixForeignFieldsInDescriptor(*file_->message_type(i), nullptr);
  }
  for (int i = 0; i < file_->message_type_count(); ++i) {
    AddMessageToFileDescriptor(*file_->message_type(i));
  }
  for (int i = 0; i < file_->enum_type_count(); ++i) {
    AddEnumToFileDescriptor(*file_->enum_type(i));
  }
  for (int i = 0; i < file_->extension_count(); ++i) {
    AddExtensionToFileDescriptor(*file_->extension(i));
  }

  // TODO(jieluo): Move this register to PrintFileDescriptor() when
  // FieldDescriptor.file is added in generated file.
  printer_->Print("_sym_db.RegisterFileDescriptor($name$)\n", "name",
                  kDescriptorKey);
  printer_->Print("\n");
}